

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawNumber::Tick
          (CommandDrawNumber *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  APlayerPawn *activator;
  bool bVar1;
  int iVar2;
  AHexenArmor *pAVar3;
  int *piVar4;
  AActor *pAVar5;
  AInventory *pAVar6;
  FBaseCVar *pFVar7;
  char *pcVar8;
  __type _Var9;
  double dVar10;
  char *local_f8;
  uint local_e4;
  char *local_d0;
  int local_c0;
  int local_bc;
  int local_b4;
  int local_a4;
  int limit;
  int maxval;
  bool useFillZeros;
  ECVarType cvartype;
  FBaseCVar *CVar;
  AInventory *item_3;
  AInventory *item_2;
  APowerup *powerup;
  PClassActor *powerupType;
  AHexenArmor *harmor;
  double add;
  AInventory *item_1;
  AInventory *item;
  int num;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawNumber *this_local;
  
  if (((this->super_CommandDrawString).field_0x5f & 1) != 0) {
    (this->super_CommandDrawString).cache = -1;
    CommandDrawString::Tick(&this->super_CommandDrawString,block,statusBar,hudChanged);
  }
  item._0_4_ = (this->super_CommandDrawString).valueArgument;
  switch(this->value) {
  case HEALTH:
    item._0_4_ = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).health;
    if (((((this->super_CommandDrawString).super_SBarInfoCommand.script)->lowerHealthCap & 1U) != 0)
       && ((int)item < 0)) {
      item._0_4_ = 0;
    }
    if ((((this->super_CommandDrawString).super_SBarInfoCommand.script)->interpolateHealth & 1U) !=
        0) {
      this->interpolationSpeed =
           ((this->super_CommandDrawString).super_SBarInfoCommand.script)->interpolationSpeed;
    }
    break;
  case ARMOR:
    if (statusBar->armor == (ABasicArmor *)0x0) {
      local_a4 = 0;
    }
    else {
      local_a4 = (statusBar->armor->super_AArmor).super_AInventory.Amount;
    }
    item._0_4_ = local_a4;
    if ((((this->super_CommandDrawString).super_SBarInfoCommand.script)->interpolateArmor & 1U) != 0
       ) {
      this->interpolationSpeed =
           ((this->super_CommandDrawString).super_SBarInfoCommand.script)->armorInterpolationSpeed;
    }
    break;
  case AMMO1:
    if (statusBar->ammo1 == (AAmmo *)0x0) {
      FString::operator=(&(this->super_CommandDrawString).str,"");
      return;
    }
    item._0_4_ = statusBar->ammocount1;
    break;
  case AMMO2:
    if (statusBar->ammo2 == (AAmmo *)0x0) {
      FString::operator=(&(this->super_CommandDrawString).str,"");
      return;
    }
    item._0_4_ = statusBar->ammocount2;
    break;
  case AMMO:
    pAVar6 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        this->inventoryItem,false);
    if (pAVar6 == (AInventory *)0x0) {
      item._0_4_ = 0;
    }
    else {
      item._0_4_ = pAVar6->Amount;
    }
    break;
  case AMMO1CAPACITY:
    if (statusBar->ammo1 == (AAmmo *)0x0) {
      FString::operator=(&(this->super_CommandDrawString).str,"");
      return;
    }
    item._0_4_ = (statusBar->ammo1->super_AInventory).MaxAmount;
    break;
  case AMMO2CAPACITY:
    if (statusBar->ammo2 == (AAmmo *)0x0) {
      FString::operator=(&(this->super_CommandDrawString).str,"");
      return;
    }
    item._0_4_ = (statusBar->ammo2->super_AInventory).MaxAmount;
    break;
  case AMMOCAPACITY:
    pAVar6 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        this->inventoryItem,false);
    if (pAVar6 == (AInventory *)0x0) {
      pAVar5 = GetDefaultByType(&this->inventoryItem->super_PClass);
      item._0_4_ = *(int *)((long)&pAVar5[1].super_DThinker.super_DObject.Class + 4);
    }
    else {
      item._0_4_ = pAVar6->MaxAmount;
    }
    break;
  case FRAGS:
    item._0_4_ = ((statusBar->super_DBaseStatusBar).CPlayer)->fragcount;
    break;
  case INVENTORY:
    pAVar6 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        this->inventoryItem,false);
    if (pAVar6 == (AInventory *)0x0) {
      item._0_4_ = 0;
    }
    else {
      item._0_4_ = pAVar6->Amount;
    }
    break;
  case KILLS:
    item._0_4_ = ::level.killed_monsters;
    break;
  case MONSTERS:
    item._0_4_ = ::level.total_monsters;
    break;
  case ITEMS:
    item._0_4_ = ::level.found_items;
    break;
  case TOTALITEMS:
    item._0_4_ = ::level.total_items;
    break;
  case SECRETS:
    item._0_4_ = ::level.found_secrets;
    break;
  case TOTALSECRETS:
    item._0_4_ = ::level.total_secrets;
    break;
  case ARMORCLASS:
  case SAVEPERCENT:
    harmor = (AHexenArmor *)0x0;
    pAVar3 = AActor::FindInventory<AHexenArmor>
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
    if (pAVar3 != (AHexenArmor *)0x0) {
      harmor = (AHexenArmor *)
               (pAVar3->Slots[0] + pAVar3->Slots[1] + pAVar3->Slots[2] + pAVar3->Slots[3] +
               pAVar3->Slots[4]);
    }
    if (statusBar->armor != (ABasicArmor *)0x0) {
      harmor = (AHexenArmor *)(statusBar->armor->SavePercent * 100.0 + (double)harmor);
    }
    if (this->value == ARMORCLASS) {
      harmor = (AHexenArmor *)((double)harmor / 5.0);
    }
    item._0_4_ = (int)(double)harmor;
    break;
  case GLOBALVAR:
    item._0_4_ = ACS_GlobalVars[(this->super_CommandDrawString).valueArgument];
    break;
  case GLOBALARRAY:
    piVar4 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::operator[]
                       (ACS_GlobalArrays + (this->super_CommandDrawString).valueArgument,
                        consoleplayer);
    item._0_4_ = *piVar4;
    break;
  case POWERUPTIME:
    pAVar5 = GetDefaultByType(&this->inventoryItem->super_PClass);
    pAVar6 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                        (PClassActor *)pAVar5[1].sprev,false);
    if (pAVar6 != (AInventory *)0x0) {
      item._0_4_ = *(int *)&pAVar6->field_0x4fc / 0x23 + 1;
    }
    break;
  case AIRTIME:
    if ((((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).waterlevel < 3) {
      item._0_4_ = ::level.airsupply / 0x23;
    }
    else {
      item._0_4_ = clamp<int>(((((statusBar->super_DBaseStatusBar).CPlayer)->air_finished -
                               ::level.time) + 0x22) / 0x23,0,0x7fffffff);
    }
    break;
  case SELECTEDINVENTORY:
    bVar1 = TObjPtr<AInventory>::operator!=
                      (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel,(AInventory *)0x0);
    if (bVar1) {
      pAVar6 = TObjPtr<AInventory>::operator->
                         (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      item._0_4_ = pAVar6->Amount;
    }
    break;
  case SCORE:
    item._0_4_ = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Score;
    break;
  case ACCURACY:
    item._0_4_ = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy;
    break;
  case STAMINA:
    item._0_4_ = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina;
    break;
  case KEYS:
    item._0_4_ = 0;
    for (CVar = (FBaseCVar *)
                ::TObjPtr::operator_cast_to_AInventory_
                          ((TObjPtr *)
                           &(((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).
                            Inventory); CVar != (FBaseCVar *)0x0;
        CVar = (FBaseCVar *)
               ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&CVar[0x17].m_Callback)) {
      bVar1 = DObject::IsKindOf((DObject *)CVar,AKey::RegistrationInfo.MyClass);
      if (bVar1) {
        item._0_4_ = (int)item + 1;
      }
    }
    break;
  case INTCVAR:
    activator = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pcVar8 = FString::operator_cast_to_char_(&this->cvarName);
    pFVar7 = GetCVar(&activator->super_AActor,pcVar8);
    if ((pFVar7 == (FBaseCVar *)0x0) ||
       ((iVar2 = (*pFVar7->_vptr_FBaseCVar[2])(), iVar2 != 0 && (iVar2 != 1)))) {
      item._0_4_ = 0;
    }
    else {
      item._0_4_ = (*pFVar7->_vptr_FBaseCVar[4])();
    }
  }
  if ((this->interpolationSpeed == 0) || ((hudChanged && (::level.time != 1)))) {
    this->drawValue = (int)item;
  }
  else if ((int)item < this->drawValue) {
    iVar2 = clamp<int>(this->drawValue - (int)item >> 2,1,this->interpolationSpeed);
    this->drawValue = this->drawValue - iVar2;
  }
  else if (this->drawValue < (int)item) {
    iVar2 = clamp<int>((int)item - this->drawValue >> 2,1,this->interpolationSpeed);
    this->drawValue = iVar2 + this->drawValue;
  }
  if ((((this->super_CommandDrawString).field_0x5d & 1) == 0) || (this->drawValue != 0)) {
    (this->super_CommandDrawString).translation = this->normalTranslation;
    if ((this->lowValue == -1) || (this->lowValue < this->drawValue)) {
      if ((this->highValue != -1) && (this->highValue <= this->drawValue)) {
        (this->super_CommandDrawString).translation = this->highTranslation;
      }
    }
    else {
      (this->super_CommandDrawString).translation = this->lowTranslation;
    }
    limit._3_1_ = (this->super_CommandDrawString).field_0x5c & 1;
    if (((this->super_CommandDrawString).field_0x5e & 1) == 0) {
      if (this->length < 10) {
        _Var9 = std::pow<double,int>(10.0,this->length);
        dVar10 = ceil(_Var9);
        local_b4 = (int)dVar10 + -1;
      }
      else {
        local_b4 = 0x7fffffff;
      }
      if ((((this->super_CommandDrawString).field_0x5c & 1) == 0) || (this->length == 1)) {
        iVar2 = clamp<int>(this->drawValue,-local_b4,local_b4);
        this->drawValue = iVar2;
      }
      else {
        iVar2 = this->drawValue;
        if (this->length < 10) {
          _Var9 = std::pow<double,int>(10.0,this->length + -1);
          dVar10 = ceil(_Var9);
          local_bc = (int)-(dVar10 - 1.0);
        }
        else {
          local_bc = -0x80000000;
        }
        iVar2 = clamp<int>(iVar2,local_bc,local_b4);
        this->drawValue = iVar2;
      }
    }
    else if (this->length < 10) {
      if ((this->length < 2) || (-1 < this->drawValue)) {
        local_c0 = this->length;
      }
      else {
        local_c0 = this->length + -1;
      }
      _Var9 = std::pow<double,int>(10.0,local_c0);
      dVar10 = ceil(_Var9);
      if ((int)dVar10 <= this->drawValue) {
        limit._3_1_ = 1;
      }
      this->drawValue = this->drawValue % (int)dVar10;
    }
    if (limit._3_1_ == 0) {
      if (((this->super_CommandDrawString).field_0x5f & 1) == 0) {
        local_f8 = "";
      }
      else {
        local_f8 = FString::GetChars(&(this->super_CommandDrawString).str);
      }
      pcVar8 = FString::GetChars(&this->prefixPadding);
      FString::Format(&(this->super_CommandDrawString).str,"%s%s%d",local_f8,pcVar8,
                      (ulong)(uint)this->drawValue);
    }
    else {
      if (((this->super_CommandDrawString).field_0x5f & 1) == 0) {
        local_d0 = "";
      }
      else {
        local_d0 = FString::GetChars(&(this->super_CommandDrawString).str);
      }
      pcVar8 = FString::GetChars(&this->prefixPadding);
      if (this->drawValue < 0) {
        local_e4 = this->length - 1;
      }
      else {
        local_e4 = this->length;
      }
      FString::Format(&(this->super_CommandDrawString).str,"%s%s%0*d",local_d0,pcVar8,
                      (ulong)local_e4,(ulong)(uint)this->drawValue);
    }
    CommandDrawString::RealignString(&this->super_CommandDrawString);
  }
  else {
    FString::operator=(&(this->super_CommandDrawString).str,"");
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			if(usePrefix)
			{
				cache = -1; // Disable the cache since we are using the same variables.
				CommandDrawString::Tick(block, statusBar, hudChanged);
			}

			int num = valueArgument;
			switch(value)
			{
				case HEALTH:
					num = statusBar->CPlayer->mo->health;
					if(script->lowerHealthCap && num < 0) //health shouldn't display negatives
						num = 0;
					if(script->interpolateHealth)
						interpolationSpeed = script->interpolationSpeed;
					break;
				case ARMOR:
					num = statusBar->armor != NULL ? statusBar->armor->Amount : 0;
					if(script->interpolateArmor)
						interpolationSpeed = script->armorInterpolationSpeed;
					break;
				case AMMO1:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount1;
					break;
				case AMMO2:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount2;
					break;
				case AMMO:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AMMO1CAPACITY:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo1->MaxAmount;
					break;
				case AMMO2CAPACITY:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo2->MaxAmount;
					break;
				case AMMOCAPACITY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->MaxAmount;
					else
						num = ((AInventory *)GetDefaultByType(inventoryItem))->MaxAmount;
					break;
				}
				case FRAGS:
					num = statusBar->CPlayer->fragcount;
					break;
				case KILLS:
					num = level.killed_monsters;
					break;
				case MONSTERS:
					num = level.total_monsters;
					break;
				case ITEMS:
					num = level.found_items;
					break;
				case TOTALITEMS:
					num = level.total_items;
					break;
				case SECRETS:
					num = level.found_secrets;
					break;
				case SCORE:
					num = statusBar->CPlayer->mo->Score;
					break;
				case TOTALSECRETS:
					num = level.total_secrets;
					break;
				case ARMORCLASS:
				case SAVEPERCENT:
				{
					double add = 0;
					AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
					if(harmor != NULL)
					{
						add = harmor->Slots[0] + harmor->Slots[1] +
							harmor->Slots[2] + harmor->Slots[3] + harmor->Slots[4];
					}
					//Hexen counts basic armor also so we should too.
					if(statusBar->armor != NULL)
					{
						add += statusBar->armor->SavePercent * 100;
					}
					if(value == ARMORCLASS)
						add /= 5;
					num = int(add);
					break;
				}
				case GLOBALVAR:
					num = ACS_GlobalVars[valueArgument];
					break;
				case GLOBALARRAY:
					num = ACS_GlobalArrays[valueArgument][consoleplayer];
					break;
				case POWERUPTIME:
				{
					//Get the PowerupType and check to see if the player has any in inventory.
					PClassActor* powerupType = ((APowerupGiver*) GetDefaultByType(inventoryItem))->PowerupType;
					APowerup* powerup = (APowerup*) statusBar->CPlayer->mo->FindInventory(powerupType);
					if(powerup != NULL)
						num = powerup->EffectTics / TICRATE + 1;
					break;
				}
				case INVENTORY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AIRTIME:
				{
					if(statusBar->CPlayer->mo->waterlevel < 3)
						num = level.airsupply/TICRATE;
					else
						num = clamp<int>((statusBar->CPlayer->air_finished - level.time + (TICRATE-1))/TICRATE, 0, INT_MAX);
					break;
				}
				case SELECTEDINVENTORY:
					if(statusBar->CPlayer->mo->InvSel != NULL)
						num = statusBar->CPlayer->mo->InvSel->Amount;
					break;
				case ACCURACY:
					num = statusBar->CPlayer->mo->accuracy;
					break;
				case STAMINA:
					num = statusBar->CPlayer->mo->stamina;
					break;
				case KEYS:
					num = 0;
					for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
					{
						if(item->IsKindOf(RUNTIME_CLASS(AKey)))
							num++;
					}
					break;
				case INTCVAR:
				{
					FBaseCVar *CVar = GetCVar(statusBar->CPlayer->mo, cvarName);
					if (CVar != nullptr)
					{
						ECVarType cvartype = CVar->GetRealType();

						if (cvartype == CVAR_Bool || cvartype == CVAR_Int)
						{
							num = CVar->GetGenericRep(CVAR_Int).Int;
							break;
						}
					}

					// Fallback in case of bad cvar/type. Unset can remove a cvar at will.
					num = 0;
					break;
				}
				default: break;
			}
			if(interpolationSpeed != 0 && (!hudChanged || level.time == 1))
			{
				if(num < drawValue)
					drawValue -= clamp<int>((drawValue - num) >> 2, 1, interpolationSpeed);
				else if(drawValue < num)
					drawValue += clamp<int>((num - drawValue) >> 2, 1, interpolationSpeed);
			}
			else
				drawValue = num;
			if(whenNotZero && drawValue == 0)
			{
				str = "";
				return;
			}
		
			translation = normalTranslation;
			if(lowValue != -1 && drawValue <= lowValue) //low
				translation = lowTranslation;
			else if(highValue != -1 && drawValue >= highValue) //high
				translation = highTranslation;

			bool useFillZeros = fillZeros;
			if(!dontCap)
			{
				// 10^9 is a largest we can hold in a 32-bit int.  So if we go any larger we have to toss out the positions limit.
				int maxval = length <= 9 ? (int) ceil(pow(10., length))-1 : INT_MAX;
				if(!fillZeros || length == 1)
					drawValue = clamp(drawValue, -maxval, maxval);
				else //The community wanted negatives to take the last digit, but we can only do this if there is room
					drawValue = clamp(drawValue, length <= 9 ? (int) -(ceil(pow(10., length-1))-1) : INT_MIN, maxval);
			}
			else if(length <= 9)
			{
				int limit = (int) ceil(pow(10., length > 1 && drawValue < 0 ? length - 1 : length));
				if(drawValue >= limit)
					useFillZeros = true;
				drawValue = drawValue%limit;
			}

			if(useFillZeros)
				str.Format("%s%s%0*d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue < 0 ? length - 1 : length, drawValue);
			else
				str.Format("%s%s%d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue);

			RealignString();
		}